

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

void __thiscall xmrig::OclBackend::stop(OclBackend *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  if ((this->d_ptr->threads).
      super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->d_ptr->threads).
      super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar1 = Chrono::steadyMSecs();
    Workers<xmrig::OclLaunchData>::stop(&this->d_ptr->workers);
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::clear
              (&this->d_ptr->threads);
    OclSharedState::release();
    uVar2 = Chrono::steadyMSecs();
    Log::print(INFO,"%s\x1b[0;33m stopped\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m",
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m",uVar2 - uVar1);
    return;
  }
  return;
}

Assistant:

void xmrig::OclBackend::stop()
{
    if (d_ptr->threads.empty()) {
        return;
    }

    const uint64_t ts = Chrono::steadyMSecs();

    d_ptr->workers.stop();
    d_ptr->threads.clear();

    OclSharedState::release();

    LOG_INFO("%s" YELLOW(" stopped") BLACK_BOLD(" (%" PRIu64 " ms)"), tag, Chrono::steadyMSecs() - ts);
}